

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O1

int __thiscall cmCPackRPMGenerator::PackageComponents(cmCPackRPMGenerator *this,bool ignoreGroup)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  cmCPackLog *pcVar3;
  size_t sVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  char *__s;
  _Rb_tree_node_base *p_Var14;
  long *plVar15;
  _Base_ptr p_Var16;
  ostream *poVar17;
  size_type *psVar18;
  undefined7 in_register_00000031;
  uint uVar19;
  size_t sVar20;
  string mainComponentUpper;
  string component_4;
  string component;
  string initialTopLevel;
  string local_2e8;
  _Rb_tree_node_base *local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  _Rb_tree_node_base *local_2a0;
  _Rb_tree_node_base *local_298;
  string local_290;
  undefined1 local_270 [112];
  ios_base local_200 [264];
  long *local_f8;
  long local_e8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  _Rb_tree_node_base *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_2a0 = (_Rb_tree_node_base *)
              CONCAT44(local_2a0._4_4_,(int)CONCAT71(in_register_00000031,ignoreGroup));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&(this->super_cmCPackGenerator).packageFileNames,
                    (this->super_cmCPackGenerator).packageFileNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_270._0_8_ = local_270 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_270,"CPACK_TEMPORARY_DIRECTORY","");
  __s = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,__s,(allocator<char> *)&local_70);
  if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
    operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
  }
  local_270._0_8_ = local_270 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"CPACK_RPM_MAIN_COMPONENT","")
  ;
  p_Var14 = (_Rb_tree_node_base *)
            cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_270);
  if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
    operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
  }
  local_270._0_8_ = local_270 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_270,"CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE","");
  bVar9 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)local_270);
  if (bVar9) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"CPACK_RPM_DEBUGINFO_PACKAGE","");
    bVar9 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_70);
    bVar9 = !bVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar9 = false;
  }
  if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
    operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
  }
  if (bVar9) {
    local_298 = p_Var14;
    if ((char)local_2a0 == '\0') {
      p_Var14 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      local_2c8 = &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header
                   ._M_header;
      if (p_Var14 == local_2c8) {
        bVar9 = true;
      }
      else {
        bVar9 = true;
        do {
          local_270._0_8_ = local_270 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_270,*(long *)(p_Var14 + 1),
                     (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
          uVar8 = local_270._8_8_;
          uVar7 = local_270._0_8_;
          if (local_270._8_8_ != 0) {
            sVar20 = 0;
            do {
              iVar12 = toupper((int)*(char *)(uVar7 + sVar20));
              *(char *)(uVar7 + sVar20) = (char)iVar12;
              sVar20 = sVar20 + 1;
            } while (uVar8 != sVar20);
          }
          std::operator+(&local_2c0,"CPACK_RPM_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var14 + 1));
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_2c0);
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
          psVar18 = (size_type *)(plVar15 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_2e8.field_2._M_allocated_capacity = *psVar18;
            local_2e8.field_2._8_8_ = plVar15[3];
          }
          else {
            local_2e8.field_2._M_allocated_capacity = *psVar18;
            local_2e8._M_dataplus._M_p = (pointer)*plVar15;
          }
          local_2e8._M_string_length = plVar15[1];
          *plVar15 = (long)psVar18;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          bVar10 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_2e8);
          bVar11 = true;
          if (!bVar10) {
            std::operator+(&local_d8,"CPACK_RPM_",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_270);
            plVar15 = (long *)std::__cxx11::string::append((char *)&local_d8);
            psVar18 = (size_type *)(plVar15 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar15 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar18) {
              local_290.field_2._M_allocated_capacity = *psVar18;
              local_290.field_2._8_8_ = plVar15[3];
              local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            }
            else {
              local_290.field_2._M_allocated_capacity = *psVar18;
              local_290._M_dataplus._M_p = (pointer)*plVar15;
            }
            local_290._M_string_length = plVar15[1];
            *plVar15 = (long)psVar18;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            bVar11 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_290);
          }
          if (!bVar10) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
          }
          if (bVar11 != false) {
            bVar9 = false;
          }
          if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
            operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
          }
        } while ((bVar11 == false) &&
                (p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14),
                p_Var14 != local_2c8));
      }
      if (bVar9) {
        p_Var16 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        p_Var14 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                   _M_header;
        if (p_Var16 != p_Var14) {
          local_2c8 = p_Var14;
          do {
            if (*(long *)(p_Var16 + 4) == 0) {
              local_270._0_8_ = local_270 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_270,*(long *)(p_Var16 + 1),
                         (long)&(p_Var16[1]._M_parent)->_M_color + *(long *)(p_Var16 + 1));
              uVar8 = local_270._8_8_;
              uVar7 = local_270._0_8_;
              if (local_270._8_8_ != 0) {
                sVar20 = 0;
                do {
                  iVar12 = toupper((int)*(char *)(uVar7 + sVar20));
                  *(char *)(uVar7 + sVar20) = (char)iVar12;
                  sVar20 = sVar20 + 1;
                } while (uVar8 != sVar20);
              }
              std::operator+(&local_2c0,"CPACK_RPM_",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var16 + 1));
              plVar15 = (long *)std::__cxx11::string::append((char *)&local_2c0);
              psVar18 = (size_type *)(plVar15 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar15 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_2e8.field_2._M_allocated_capacity = *psVar18;
                local_2e8.field_2._8_8_ = plVar15[3];
                local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
              }
              else {
                local_2e8.field_2._M_allocated_capacity = *psVar18;
                local_2e8._M_dataplus._M_p = (pointer)*plVar15;
              }
              local_2e8._M_string_length = plVar15[1];
              *plVar15 = (long)psVar18;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              bVar10 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_2e8);
              bVar11 = true;
              if (!bVar10) {
                std::operator+(&local_50,"CPACK_RPM_",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_270);
                plVar15 = (long *)std::__cxx11::string::append((char *)&local_50);
                psVar18 = (size_type *)(plVar15 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar15 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar18) {
                  local_98.field_2._M_allocated_capacity = *psVar18;
                  local_98.field_2._8_8_ = plVar15[3];
                  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                }
                else {
                  local_98.field_2._M_allocated_capacity = *psVar18;
                  local_98._M_dataplus._M_p = (pointer)*plVar15;
                }
                local_98._M_string_length = plVar15[1];
                *plVar15 = (long)psVar18;
                plVar15[1] = 0;
                *(undefined1 *)(plVar15 + 2) = 0;
                bVar11 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_98);
              }
              if (!bVar10) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_98._M_dataplus._M_p != &local_98.field_2) {
                  operator_delete(local_98._M_dataplus._M_p,
                                  local_98.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                operator_delete(local_2e8._M_dataplus._M_p,
                                local_2e8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                operator_delete(local_2c0._M_dataplus._M_p,
                                local_2c0.field_2._M_allocated_capacity + 1);
              }
              if (bVar11 != false) {
                bVar9 = false;
              }
              if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
                operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
              }
              p_Var14 = local_2c8;
              if (bVar11 != false) break;
            }
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
          } while (p_Var16 != p_Var14);
        }
      }
    }
    else {
      p_Var14 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      local_2c8 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                   _M_header;
      if (p_Var14 == local_2c8) {
        bVar9 = true;
      }
      else {
        bVar9 = true;
        do {
          local_270._0_8_ = local_270 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_270,*(long *)(p_Var14 + 1),
                     (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
          uVar8 = local_270._8_8_;
          uVar7 = local_270._0_8_;
          if (local_270._8_8_ != 0) {
            sVar20 = 0;
            do {
              iVar12 = toupper((int)*(char *)(uVar7 + sVar20));
              *(char *)(uVar7 + sVar20) = (char)iVar12;
              sVar20 = sVar20 + 1;
            } while (uVar8 != sVar20);
          }
          std::operator+(&local_2c0,"CPACK_RPM_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var14 + 1));
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_2c0);
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
          psVar18 = (size_type *)(plVar15 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_2e8.field_2._M_allocated_capacity = *psVar18;
            local_2e8.field_2._8_8_ = plVar15[3];
          }
          else {
            local_2e8.field_2._M_allocated_capacity = *psVar18;
            local_2e8._M_dataplus._M_p = (pointer)*plVar15;
          }
          local_2e8._M_string_length = plVar15[1];
          *plVar15 = (long)psVar18;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          bVar10 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_2e8);
          bVar11 = true;
          if (!bVar10) {
            std::operator+(&local_d8,"CPACK_RPM_",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_270);
            plVar15 = (long *)std::__cxx11::string::append((char *)&local_d8);
            psVar18 = (size_type *)(plVar15 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar15 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar18) {
              local_290.field_2._M_allocated_capacity = *psVar18;
              local_290.field_2._8_8_ = plVar15[3];
              local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            }
            else {
              local_290.field_2._M_allocated_capacity = *psVar18;
              local_290._M_dataplus._M_p = (pointer)*plVar15;
            }
            local_290._M_string_length = plVar15[1];
            *plVar15 = (long)psVar18;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            bVar11 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_290);
          }
          if (!bVar10) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
          }
          if (bVar11 != false) {
            bVar9 = false;
          }
          if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
            operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
          }
        } while ((bVar11 == false) &&
                (p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14),
                p_Var14 != local_2c8));
      }
    }
    p_Var14 = local_298;
    if (bVar9) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_270,"Setting ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_270,"CPACK_RPM_DEBUGINFO_PACKAGE because ",0x24);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_270,"CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE is set but ",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_270," none of the ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_270,"CPACK_RPM_<component>_DEBUGINFO_PACKAGE variables ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_270,"are set.",8);
      std::ios::widen((char)(ostream *)local_270 + (char)*(undefined8 *)(local_270._0_8_ + -0x18));
      std::ostream::put((char)local_270);
      std::ostream::flush();
      pcVar3 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      _Var5._M_p = local_2e8._M_dataplus._M_p;
      sVar20 = strlen(local_2e8._M_dataplus._M_p);
      cmCPackLog::Log(pcVar3,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                      ,0xaa,_Var5._M_p,sVar20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
      std::ios_base::~ios_base(local_200);
      local_270._0_8_ = local_270 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_270,"CPACK_RPM_DEBUGINFO_PACKAGE","");
      p_Var14 = local_298;
      cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_270,"ON");
      if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
        operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
      }
    }
  }
  local_270._0_8_ = local_270 + 0x10;
  if (p_Var14 == (_Rb_tree_node_base *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_270,"CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE","");
    bVar9 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)local_270);
    if (bVar9) {
      sVar4 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
              _M_node_count;
      if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
        operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
      }
      if (sVar4 != 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_270,"CPACK_RPM_MAIN_COMPONENT not set but",0x24);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_270," it is mandatory with CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE",
                   0x38);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_270," being set.\n",0xc)
        ;
        pcVar3 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        _Var5._M_p = local_2e8._M_dataplus._M_p;
        sVar20 = strlen(local_2e8._M_dataplus._M_p);
        cmCPackLog::Log(pcVar3,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                        ,0x149,_Var5._M_p,sVar20);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
        std::ios_base::~ios_base(local_200);
        uVar19 = 0;
        goto LAB_0017894d;
      }
    }
    else if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
      operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
    }
    if ((char)local_2a0 == '\0') {
      p_Var16 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      p_Var1 = &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header;
      uVar19 = 1;
      if ((_Rb_tree_header *)p_Var16 != p_Var1) {
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_270,"Packaging component group: ",0x1b);
          poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_270,*(char **)(p_Var16 + 1),
                               (long)p_Var16[1]._M_parent);
          std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
          std::ostream::put((char)poVar17);
          std::ostream::flush();
          pcVar3 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          _Var5._M_p = local_2e8._M_dataplus._M_p;
          sVar20 = strlen(local_2e8._M_dataplus._M_p);
          cmCPackLog::Log(pcVar3,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                          ,0x128,_Var5._M_p,sVar20);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
          std::ios_base::~ios_base(local_200);
          uVar13 = PackageOnePack(this,&local_b8,(string *)(p_Var16 + 1));
          uVar19 = uVar19 & uVar13;
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
        } while ((_Rb_tree_header *)p_Var16 != p_Var1);
      }
      p_Var16 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      p_Var1 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var16 != p_Var1) {
        do {
          if (*(long *)(p_Var16 + 4) == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_270,"Component <",0xb);
            poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_270,*(char **)(p_Var16 + 2),
                                 (long)p_Var16[2]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,"> does not belong to any group, package it separately.",0x36);
            std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
            std::ostream::put((char)poVar17);
            std::ostream::flush();
            pcVar3 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            _Var5._M_p = local_2e8._M_dataplus._M_p;
            sVar20 = strlen(local_2e8._M_dataplus._M_p);
            cmCPackLog::Log(pcVar3,2,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                            ,0x136,_Var5._M_p,sVar20);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
              operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
            std::ios_base::~ios_base(local_200);
            uVar13 = PackageOnePack(this,&local_b8,(string *)(p_Var16 + 1));
            uVar19 = uVar19 & uVar13;
          }
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
        } while ((_Rb_tree_header *)p_Var16 != p_Var1);
      }
    }
    else {
      p_Var16 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      p_Var1 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
      uVar19 = 1;
      if ((_Rb_tree_header *)p_Var16 != p_Var1) {
        do {
          uVar13 = PackageOnePack(this,&local_b8,(string *)(p_Var16 + 1));
          uVar19 = uVar19 & uVar13;
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
        } while ((_Rb_tree_header *)p_Var16 != p_Var1);
      }
    }
    goto LAB_0017894d;
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_270,"CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE","");
  bVar9 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)local_270);
  if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
    operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
  }
  if (bVar9) {
    local_270._0_8_ = local_270 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"GENERATE_SPEC_PARTS","");
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_270,"ON");
    if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
      operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
    }
  }
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  sVar20 = strlen((char *)p_Var14);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,p_Var14,
             (long)&((_Rb_tree_node_base *)&p_Var14->_M_color)->_M_color + sVar20);
  sVar6 = local_2e8._M_string_length;
  _Var5._M_p = local_2e8._M_dataplus._M_p;
  if (local_2e8._M_string_length != 0) {
    sVar20 = 0;
    do {
      iVar12 = toupper((int)_Var5._M_p[sVar20]);
      _Var5._M_p[sVar20] = (char)iVar12;
      sVar20 = sVar20 + 1;
    } while (sVar6 != sVar20);
  }
  if ((char)local_2a0 == '\0') {
    p_Var1 = &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header;
    p_Var16 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
              _M_header._M_left;
    local_2a0 = &p_Var1->_M_header;
    if ((_Rb_tree_header *)p_Var16 == p_Var1) {
      local_2c8 = (_Rb_tree_node_base *)CONCAT44(local_2c8._4_4_,1);
    }
    else {
      local_2c8 = (_Rb_tree_node_base *)CONCAT44(local_2c8._4_4_,1);
      do {
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c0,*(long *)(p_Var16 + 1),
                   (long)&(p_Var16[1]._M_parent)->_M_color + *(long *)(p_Var16 + 1));
        sVar6 = local_2c0._M_string_length;
        _Var5._M_p = local_2c0._M_dataplus._M_p;
        if (local_2c0._M_string_length != 0) {
          sVar20 = 0;
          do {
            iVar12 = toupper((int)_Var5._M_p[sVar20]);
            _Var5._M_p[sVar20] = (char)iVar12;
            sVar20 = sVar20 + 1;
          } while (sVar6 != sVar20);
        }
        if ((local_2e8._M_string_length != local_2c0._M_string_length) ||
           ((p_Var14 = p_Var16, local_2e8._M_string_length != 0 &&
            (iVar12 = bcmp(local_2e8._M_dataplus._M_p,local_2c0._M_dataplus._M_p,
                           local_2e8._M_string_length), iVar12 != 0)))) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_270,"Packaging component group: ",0x1b);
          poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_270,*(char **)(p_Var16 + 1),
                               (long)p_Var16[1]._M_parent);
          std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
          std::ostream::put((char)poVar17);
          std::ostream::flush();
          pcVar3 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          plVar15 = local_f8;
          sVar20 = strlen((char *)local_f8);
          cmCPackLog::Log(pcVar3,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                          ,0xcd,(char *)plVar15,sVar20);
          if (local_f8 != local_e8) {
            operator_delete(local_f8,local_e8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
          std::ios_base::~ios_base(local_200);
          uVar19 = PackageOnePack(this,&local_b8,(string *)(p_Var16 + 1));
          local_2c8 = (_Rb_tree_node_base *)CONCAT44(local_2c8._4_4_,(uint)local_2c8 & uVar19);
          p_Var14 = local_2a0;
        }
        local_2a0 = p_Var14;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
      } while ((_Rb_tree_header *)p_Var16 != p_Var1);
    }
    p_Var2 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
    p_Var16 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_header
              ._M_left;
    local_298 = &p_Var2->_M_header;
    local_78 = &p_Var1->_M_header;
    if ((_Rb_tree_header *)p_Var16 != p_Var2) {
      do {
        if (*(long *)(p_Var16 + 4) == 0) {
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2c0,*(long *)(p_Var16 + 1),
                     (long)&(p_Var16[1]._M_parent)->_M_color + *(long *)(p_Var16 + 1));
          sVar6 = local_2c0._M_string_length;
          _Var5._M_p = local_2c0._M_dataplus._M_p;
          if (local_2c0._M_string_length != 0) {
            sVar20 = 0;
            do {
              iVar12 = toupper((int)_Var5._M_p[sVar20]);
              _Var5._M_p[sVar20] = (char)iVar12;
              sVar20 = sVar20 + 1;
            } while (sVar6 != sVar20);
          }
          if ((local_2e8._M_string_length != local_2c0._M_string_length) ||
             ((p_Var14 = p_Var16, local_2e8._M_string_length != 0 &&
              (iVar12 = bcmp(local_2e8._M_dataplus._M_p,local_2c0._M_dataplus._M_p,
                             local_2e8._M_string_length), iVar12 != 0)))) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_270,"Component <",0xb);
            poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_270,*(char **)(p_Var16 + 2),
                                 (long)p_Var16[2]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,"> does not belong to any group, package it separately.",0x36);
            std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
            std::ostream::put((char)poVar17);
            std::ostream::flush();
            pcVar3 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            plVar15 = local_f8;
            sVar20 = strlen((char *)local_f8);
            cmCPackLog::Log(pcVar3,2,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                            ,0xe7,(char *)plVar15,sVar20);
            if (local_f8 != local_e8) {
              operator_delete(local_f8,local_e8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
            std::ios_base::~ios_base(local_200);
            uVar19 = PackageOnePack(this,&local_b8,(string *)(p_Var16 + 1));
            local_2c8 = (_Rb_tree_node_base *)CONCAT44(local_2c8._4_4_,(uint)local_2c8 & uVar19);
            p_Var14 = local_298;
          }
          local_298 = p_Var14;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
      } while ((_Rb_tree_header *)p_Var16 != p_Var2);
    }
    uVar19 = 0;
    if ((uint)local_2c8 != 0) {
      local_270._0_8_ = local_270 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"GENERATE_SPEC_PARTS","");
      cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_270,"OFF");
      if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
        operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
      }
      p_Var14 = local_2a0;
      if ((local_2a0 == local_78) && (p_Var14 = local_298, (_Rb_tree_header *)local_298 == p_Var2))
      {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_270,"CPACK_RPM_MAIN_COMPONENT set",0x1c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_270," to non existing component.\n",0x1c);
        pcVar3 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        _Var5._M_p = local_2c0._M_dataplus._M_p;
        sVar20 = strlen(local_2c0._M_dataplus._M_p);
        cmCPackLog::Log(pcVar3,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                        ,0xf6,_Var5._M_p,sVar20);
        goto LAB_001788f5;
      }
      uVar19 = PackageOnePack(this,&local_b8,(string *)(p_Var14 + 1));
    }
  }
  else {
    p_Var1 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
    p_Var16 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_header
              ._M_left;
    if ((_Rb_tree_header *)p_Var16 == p_Var1) {
      bVar9 = false;
      p_Var14 = &p_Var1->_M_header;
    }
    else {
      uVar19 = 1;
      local_2c8 = &p_Var1->_M_header;
      do {
        local_270._0_8_ = local_270 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_270,*(long *)(p_Var16 + 1),
                   (long)&(p_Var16[1]._M_parent)->_M_color + *(long *)(p_Var16 + 1));
        uVar8 = local_270._8_8_;
        uVar7 = local_270._0_8_;
        if (local_270._8_8_ != 0) {
          sVar20 = 0;
          do {
            iVar12 = toupper((int)*(char *)(uVar7 + sVar20));
            *(char *)(uVar7 + sVar20) = (char)iVar12;
            sVar20 = sVar20 + 1;
          } while (uVar8 != sVar20);
        }
        if ((local_2e8._M_string_length != local_270._8_8_) ||
           ((p_Var14 = p_Var16, local_2e8._M_string_length != 0 &&
            (iVar12 = bcmp(local_2e8._M_dataplus._M_p,(void *)local_270._0_8_,
                           local_2e8._M_string_length), iVar12 != 0)))) {
          uVar13 = PackageOnePack(this,&local_b8,(string *)(p_Var16 + 1));
          uVar19 = uVar19 & uVar13;
          p_Var14 = local_2c8;
        }
        local_2c8 = p_Var14;
        if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
          operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
        }
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
      } while ((_Rb_tree_header *)p_Var16 != p_Var1);
      bVar9 = uVar19 == 0;
      p_Var14 = local_2c8;
    }
    uVar19 = 0;
    if (!bVar9) {
      local_270._0_8_ = local_270 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"GENERATE_SPEC_PARTS","");
      cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_270,"OFF");
      if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
        operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
      }
      if ((_Rb_tree_header *)p_Var14 == p_Var1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_270,"CPACK_RPM_MAIN_COMPONENT set",0x1c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_270," to non existing component.\n",0x1c);
        pcVar3 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        _Var5._M_p = local_2c0._M_dataplus._M_p;
        sVar20 = strlen(local_2c0._M_dataplus._M_p);
        cmCPackLog::Log(pcVar3,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                        ,0x119,_Var5._M_p,sVar20);
LAB_001788f5:
        uVar19 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
        std::ios_base::~ios_base(local_200);
      }
      else {
        uVar19 = PackageOnePack(this,&local_b8,(string *)(p_Var14 + 1));
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
LAB_0017894d:
  if (uVar19 != 0) {
    AddGeneratedPackageNames(this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return uVar19;
}

Assistant:

int cmCPackRPMGenerator::PackageComponents(bool ignoreGroup)
{
  int retval = 1;
  /* Reset package file name list it will be populated during the
   * component packaging run*/
  packageFileNames.clear();
  std::string initialTopLevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));

  const char* mainComponent = this->GetOption("CPACK_RPM_MAIN_COMPONENT");

  if (this->IsOn("CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE") &&
      !this->IsOn("CPACK_RPM_DEBUGINFO_PACKAGE")) {
    // check if we need to set CPACK_RPM_DEBUGINFO_PACKAGE because non of
    // the components is setting per component debuginfo package variable
    bool shouldSet = true;

    if (ignoreGroup) {
      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        std::string component(compIt->first);
        std::transform(component.begin(), component.end(), component.begin(),
                       ::toupper);

        if (this->IsOn("CPACK_RPM_" + compIt->first + "_DEBUGINFO_PACKAGE") ||
            this->IsOn("CPACK_RPM_" + component + "_DEBUGINFO_PACKAGE")) {
          shouldSet = false;
          break;
        }
      }
    } else {
      std::map<std::string, cmCPackComponentGroup>::iterator compGIt;
      for (compGIt = this->ComponentGroups.begin();
           compGIt != this->ComponentGroups.end(); ++compGIt) {
        std::string component(compGIt->first);
        std::transform(component.begin(), component.end(), component.begin(),
                       ::toupper);

        if (this->IsOn("CPACK_RPM_" + compGIt->first + "_DEBUGINFO_PACKAGE") ||
            this->IsOn("CPACK_RPM_" + component + "_DEBUGINFO_PACKAGE")) {
          shouldSet = false;
          break;
        }
      }

      if (shouldSet) {
        std::map<std::string, cmCPackComponent>::iterator compIt;
        for (compIt = this->Components.begin();
             compIt != this->Components.end(); ++compIt) {
          // Does the component belong to a group?
          if (compIt->second.Group == nullptr) {
            std::string component(compIt->first);
            std::transform(component.begin(), component.end(),
                           component.begin(), ::toupper);

            if (this->IsOn("CPACK_RPM_" + compIt->first +
                           "_DEBUGINFO_PACKAGE") ||
                this->IsOn("CPACK_RPM_" + component + "_DEBUGINFO_PACKAGE")) {
              shouldSet = false;
              break;
            }
          }
        }
      }
    }

    if (shouldSet) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Setting "
                      << "CPACK_RPM_DEBUGINFO_PACKAGE because "
                      << "CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE is set but "
                      << " none of the "
                      << "CPACK_RPM_<component>_DEBUGINFO_PACKAGE variables "
                      << "are set." << std::endl);
      this->SetOption("CPACK_RPM_DEBUGINFO_PACKAGE", "ON");
    }
  }

  if (mainComponent) {
    if (this->IsOn("CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE")) {
      this->SetOption("GENERATE_SPEC_PARTS", "ON");
    }

    std::string mainComponentUpper(mainComponent);
    std::transform(mainComponentUpper.begin(), mainComponentUpper.end(),
                   mainComponentUpper.begin(), ::toupper);

    // The default behavior is to have one package by component group
    // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
    if (!ignoreGroup) {
      std::map<std::string, cmCPackComponentGroup>::iterator mainCompGIt =
        this->ComponentGroups.end();

      std::map<std::string, cmCPackComponentGroup>::iterator compGIt;
      for (compGIt = this->ComponentGroups.begin();
           compGIt != this->ComponentGroups.end(); ++compGIt) {
        std::string component(compGIt->first);
        std::transform(component.begin(), component.end(), component.begin(),
                       ::toupper);

        if (mainComponentUpper == component) {
          // main component will be handled last
          mainCompGIt = compGIt;
          continue;
        }

        cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                      "Packaging component group: " << compGIt->first
                                                    << std::endl);
        retval &= PackageOnePack(initialTopLevel, compGIt->first);
      }
      // Handle Orphan components (components not belonging to any groups)
      std::map<std::string, cmCPackComponent>::iterator mainCompIt =
        this->Components.end();
      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        // Does the component belong to a group?
        if (compIt->second.Group == nullptr) {
          std::string component(compIt->first);
          std::transform(component.begin(), component.end(), component.begin(),
                         ::toupper);

          if (mainComponentUpper == component) {
            // main component will be handled last
            mainCompIt = compIt;
            continue;
          }

          cmCPackLogger(
            cmCPackLog::LOG_VERBOSE,
            "Component <"
              << compIt->second.Name
              << "> does not belong to any group, package it separately."
              << std::endl);
          retval &= PackageOnePack(initialTopLevel, compIt->first);
        }
      }

      if (retval) {
        this->SetOption("GENERATE_SPEC_PARTS", "OFF");

        if (mainCompGIt != this->ComponentGroups.end()) {
          retval &= PackageOnePack(initialTopLevel, mainCompGIt->first);
        } else if (mainCompIt != this->Components.end()) {
          retval &= PackageOnePack(initialTopLevel, mainCompIt->first);
        } else {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "CPACK_RPM_MAIN_COMPONENT set"
                          << " to non existing component.\n");
          retval = 0;
        }
      }
    }
    // CPACK_COMPONENTS_IGNORE_GROUPS is set
    // We build 1 package per component
    else {
      std::map<std::string, cmCPackComponent>::iterator mainCompIt =
        this->Components.end();

      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        std::string component(compIt->first);
        std::transform(component.begin(), component.end(), component.begin(),
                       ::toupper);

        if (mainComponentUpper == component) {
          // main component will be handled last
          mainCompIt = compIt;
          continue;
        }

        retval &= PackageOnePack(initialTopLevel, compIt->first);
      }

      if (retval) {
        this->SetOption("GENERATE_SPEC_PARTS", "OFF");

        if (mainCompIt != this->Components.end()) {
          retval &= PackageOnePack(initialTopLevel, mainCompIt->first);
        } else {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "CPACK_RPM_MAIN_COMPONENT set"
                          << " to non existing component.\n");
          retval = 0;
        }
      }
    }
  } else if (!this->IsOn("CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE") ||
             this->Components.size() == 1) {
    // The default behavior is to have one package by component group
    // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
    if (!ignoreGroup) {
      std::map<std::string, cmCPackComponentGroup>::iterator compGIt;
      for (compGIt = this->ComponentGroups.begin();
           compGIt != this->ComponentGroups.end(); ++compGIt) {
        cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                      "Packaging component group: " << compGIt->first
                                                    << std::endl);
        retval &= PackageOnePack(initialTopLevel, compGIt->first);
      }
      // Handle Orphan components (components not belonging to any groups)
      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        // Does the component belong to a group?
        if (compIt->second.Group == nullptr) {
          cmCPackLogger(
            cmCPackLog::LOG_VERBOSE,
            "Component <"
              << compIt->second.Name
              << "> does not belong to any group, package it separately."
              << std::endl);
          retval &= PackageOnePack(initialTopLevel, compIt->first);
        }
      }
    }
    // CPACK_COMPONENTS_IGNORE_GROUPS is set
    // We build 1 package per component
    else {
      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        retval &= PackageOnePack(initialTopLevel, compIt->first);
      }
    }
  } else {
    cmCPackLogger(
      cmCPackLog::LOG_ERROR,
      "CPACK_RPM_MAIN_COMPONENT not set but"
        << " it is mandatory with CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE"
        << " being set.\n");
    retval = 0;
  }

  if (retval) {
    AddGeneratedPackageNames();
  }

  return retval;
}